

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_to_all_zero_digital_filter_coefficients.cc
# Opt level: O0

bool __thiscall
sptk::AllPoleToAllZeroDigitalFilterCoefficients::Run
          (AllPoleToAllZeroDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *input_filter_coefficients,
          vector<double,_std::allocator<double>_> *output_filter_coefficients)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  iterator __first;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double z;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __unary_op;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  iVar5 = *(int *)(in_RDI + 8) + 1;
  if (((*(byte *)(in_RDI + 0xc) & 1) != 0) &&
     (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar2 == (long)iVar5)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    if (((*pvVar3 != 0.0) || (NAN(*pvVar3))) &&
       (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar2 != (long)iVar5) {
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      dVar1 = *pvVar3;
      __unary_op._M_current = (double *)(1.0 / dVar1);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      *pvVar4 = (value_type)__unary_op._M_current;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_ffffffffffffff98._M_current,(difference_type)__unary_op._M_current);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
      __first = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_ffffffffffffff98._M_current,(difference_type)__unary_op._M_current);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::AllPoleToAllZeroDigitalFilterCoefficients::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*)const::__0>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,(double *)(1.0 / dVar1),in_stack_ffffffffffffff98,
                 (anon_class_8_1_54a3981a)__unary_op._M_current);
      return true;
    }
  }
  return false;
}

Assistant:

bool AllPoleToAllZeroDigitalFilterCoefficients::Run(
    const std::vector<double>& input_filter_coefficients,
    std::vector<double>* output_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      input_filter_coefficients.size() != static_cast<std::size_t>(length) ||
      0.0 == input_filter_coefficients[0] ||
      NULL == output_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (output_filter_coefficients->size() != static_cast<std::size_t>(length)) {
    output_filter_coefficients->resize(length);
  }

  // Perform conversion.
  const double z(1.0 / input_filter_coefficients[0]);
  (*output_filter_coefficients)[0] = z;
  std::transform(
      input_filter_coefficients.begin() + 1, input_filter_coefficients.end(),
      output_filter_coefficients->begin() + 1, [z](double x) { return x * z; });

  return true;
}